

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KUtils.h
# Opt level: O0

KBOOL KDIS::UTILS::IsMachineBigEndian(void)

{
  int iVar1;
  
  if ((IsMachineBigEndian()::conv == '\0') &&
     (iVar1 = __cxa_guard_acquire(&IsMachineBigEndian()::conv), iVar1 != 0)) {
    NetToDataType<unsigned_short>::NetToDataType
              ((NetToDataType<unsigned_short> *)&IsMachineBigEndian::conv.field_0,
               IsMachineBigEndian::ui,false);
    __cxa_guard_release(&IsMachineBigEndian()::conv);
  }
  return IsMachineBigEndian::conv.field_0.m_Octs[0] != '\x01';
}

Assistant:

static inline KBOOL IsMachineBigEndian()
{
    static KUINT16 ui = 0x01;

    static NetToKUINT16 conv( ui, false );

    if( conv.m_Octs[0] == 0x01 )
    {
        return false;
    }
    else
    {
        return true;
    }
}